

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase146::run(TestCase146 *this)

{
  Reader reader;
  long *plVar1;
  undefined8 uVar2;
  RequestHook *pRVar3;
  PipelineOp *pPVar4;
  ArrayDisposer *pAVar5;
  CapTableBuilder *pCVar6;
  WirePointer *pWVar7;
  PipelineHook *pPVar8;
  size_t sVar9;
  PromiseNode *pPVar10;
  Event *pEVar11;
  Server *pSVar12;
  AsyncIoStream *pAVar13;
  AsyncIoProvider *pAVar14;
  TransformPromiseNodeBase *this_00;
  int iVar15;
  int iVar16;
  EventLoop *pEVar17;
  EventLoop *pEVar18;
  EventLoop *pEVar19;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  void *extraout_RDX_06;
  void *extraout_RDX_07;
  void *extraout_RDX_08;
  void *extraout_RDX_09;
  void *extraout_RDX_10;
  void *extraout_RDX_11;
  void *extraout_RDX_12;
  void *extraout_RDX_13;
  void *pvVar20;
  void *extraout_RDX_14;
  void *extraout_RDX_15;
  void *extraout_RDX_16;
  void *extraout_RDX_17;
  void *extraout_RDX_18;
  void *extraout_RDX_19;
  void *extraout_RDX_20;
  void *extraout_RDX_21;
  void *extraout_RDX_22;
  void *pvVar21;
  Event **ppEVar22;
  Disposer *pDVar23;
  bool bVar24;
  Client CVar25;
  Own<capnp::ClientHook> OVar26;
  Reader RVar27;
  ReaderOptions receiveOptions;
  bool disconnected;
  int callCount;
  int reverseCallCount;
  Response<capnproto_test::capnp::test::TestAllTypes> response2;
  RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults> promise;
  RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults> pipelinePromise;
  Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
  request;
  Promise<void> disconnectPromise;
  RemotePromise<capnproto_test::capnp::test::TestAllTypes> pipelinePromise2;
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  pipelineRequest2;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  pipelineRequest;
  PipeThread serverThread;
  AsyncIoContext ioContext;
  Response<capnproto_test::capnp::test::TestInterface::FooResults> response;
  RpcSystem<capnp::rpc::twoparty::VatId> rpcClient;
  int handleCount;
  TwoPartyVatNetwork network;
  char local_5f9;
  int local_5f8;
  int local_5f4;
  ArrayPtr<const_char> local_5f0;
  long *local_5e0;
  undefined1 local_5d8 [16];
  EventLoop *local_5c8;
  EventLoop *pEStack_5c0;
  Event *pEStack_5b8;
  Disposer *pDStack_5b0;
  RequestHook *local_5a8;
  long *local_5a0;
  undefined1 local_598 [32];
  PipelineOp *local_578;
  Disposer *pDStack_570;
  ArrayDisposer *local_568;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  local_560;
  undefined1 local_528 [16];
  Pipeline local_518;
  Own<kj::_::PromiseNode> local_4f0;
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  local_4e0;
  undefined1 local_4a8 [32];
  Event *pEStack_488;
  Disposer *pDStack_480;
  RequestHook *local_478;
  undefined1 local_468 [32];
  Event *pEStack_448;
  Disposer *pDStack_440;
  RequestHook *local_438;
  undefined1 local_430 [16];
  Server *pSStack_420;
  PipeThread local_418;
  undefined8 *local_3f8;
  long *local_3f0;
  undefined8 *local_3e8;
  AsyncIoProvider *local_3e0;
  WaitScope *local_3d8;
  undefined1 local_3c8 [368];
  RpcSystemBase local_258;
  int local_244;
  Maybe<capnp::MessageSize> local_240;
  Maybe<capnp::MessageSize> local_228;
  Maybe<capnp::MessageSize> local_210;
  Maybe<capnp::MessageSize> local_1f8;
  Maybe<capnp::MessageSize> local_1e0;
  Maybe<capnp::MessageSize> local_1c8;
  TwoPartyVatNetwork local_1b0;
  
  kj::setupAsyncIo();
  local_5f8 = 0;
  local_244 = 0;
  local_5f4 = 0;
  runServer(&local_418,local_3e0,&local_5f8,&local_244);
  receiveOptions._8_8_ = 0x40;
  receiveOptions.traversalLimitInWords = 0x800000;
  iVar16 = 0x40;
  TwoPartyVatNetwork::TwoPartyVatNetwork(&local_1b0,local_418.pipe.ptr,CLIENT,receiveOptions);
  makeRpcClient<capnp::rpc::twoparty::VatId,capnp::rpc::twoparty::ProvisionId,capnp::rpc::twoparty::RecipientId,capnp::rpc::twoparty::ThirdPartyCapId,capnp::rpc::twoparty::JoinResult>
            ((capnp *)&local_258,&local_1b0.super_TwoPartyVatNetworkBase);
  local_5f9 = '\0';
  kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)local_3c8);
  this_00 = (TransformPromiseNodeBase *)operator_new(0x30);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,(Own<kj::_::PromiseNode> *)local_3c8,
             kj::_::
             TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++:157:69),_kj::_::PropagateException>
             ::anon_class_8_1_ce360c39_for_func::operator());
  uVar2 = local_3c8._8_8_;
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00610d40;
  this_00[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)&local_5f9;
  local_4f0.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase146::run()::$_0,kj::_::PropagateException>>
        ::instance;
  local_4f0.ptr = (PromiseNode *)this_00;
  if ((Server *)local_3c8._8_8_ != (Server *)0x0) {
    local_3c8._8_8_ = (Server *)0x0;
    (**(code **)*(_func_int **)local_3c8._0_8_)
              (local_3c8._0_8_,(char *)(uVar2 + (long)(*(_func_int ***)uVar2)[-2]));
  }
  CVar25 = getPersistentCap((RpcSystem<capnp::rpc::twoparty::VatId> *)local_5d8,(Side)&local_258,
                            TEST_PIPELINE);
  (*((BootstrapFactoryBase *)local_5d8._8_8_)->_vptr_BootstrapFactoryBase[4])
            (local_3c8,local_5d8._8_8_,CVar25.hook.ptr);
  uVar2 = local_5d8._8_8_;
  local_430._8_4_ = local_3c8._0_4_;
  local_430._12_4_ = local_3c8._4_4_;
  pSStack_420 = (Server *)local_3c8._8_8_;
  local_430._0_8_ = &capnproto_test::capnp::test::TestPipeline::Client::typeinfo;
  if ((Impl *)local_5d8._8_8_ != (Impl *)0x0) {
    local_5d8._8_8_ = (Impl *)0x0;
    (*(code *)((SegmentReader *)local_5d8._0_8_)->arena->_vptr_Arena)
              (local_5d8._0_8_,
               ((BootstrapFactoryBase *)uVar2)->_vptr_BootstrapFactoryBase[-2] +
               (long)(BootstrapFactoryBase *)uVar2);
  }
  local_1c8.ptr.isSet = false;
  capnproto_test::capnp::test::TestPipeline::Client::getCapRequest
            ((Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
              *)local_528,(Client *)local_430,&local_1c8);
  *(undefined4 *)&(local_518.hook.disposer)->_vptr_Disposer = 0xea;
  kj::heap<capnp::_::TestInterfaceImpl,int&>((kj *)local_598,&local_5f4);
  pEVar17 = (EventLoop *)local_598._8_8_;
  local_3c8._0_8_ = local_598._0_8_;
  local_3c8._8_8_ = local_598._8_8_ + 0x10;
  if ((EventLoop *)local_598._8_8_ == (EventLoop *)0x0) {
    local_3c8._8_8_ = (Server *)0x0;
  }
  local_598._8_8_ = (EventLoop *)0x0;
  OVar26 = Capability::Client::makeLocalClient
                     ((Client *)(local_5d8 + 8),(Own<capnp::Capability::Server> *)local_3c8);
  uVar2 = local_3c8._8_8_;
  if ((Server *)local_3c8._8_8_ != (Server *)0x0) {
    local_3c8._8_8_ = (Server *)0x0;
    (**(code **)*(_func_int **)local_3c8._0_8_)
              (local_3c8._0_8_,(char *)(uVar2 + (long)(*(Event **)uVar2)[-1].prev),OVar26.ptr);
  }
  local_5d8._0_8_ = &Capability::Client::typeinfo;
  local_3c8._0_8_ = local_528._0_8_;
  local_3c8._8_8_ = local_528._8_8_;
  local_3c8._16_8_ = local_518.hook.ptr;
  PointerBuilder::setCapability
            ((PointerBuilder *)local_3c8,(Own<capnp::ClientHook> *)(local_5d8 + 8));
  pEVar19 = local_5c8;
  pvVar20 = extraout_RDX;
  if (local_5c8 != (EventLoop *)0x0) {
    local_5c8 = (EventLoop *)0x0;
    (**((BootstrapFactoryBase *)local_5d8._8_8_)->_vptr_BootstrapFactoryBase)
              (local_5d8._8_8_,
               (long)&((WireValue<uint32_t>_conflict *)&pEVar19->port)->value +
               *(long *)((long)*(WirePointer *)pEVar19 + -0x10));
    pvVar20 = extraout_RDX_00;
  }
  uVar2 = local_598._8_8_;
  if ((EventLoop *)local_598._8_8_ != (EventLoop *)0x0) {
    local_598._8_8_ = (EventLoop *)0x0;
    (*(code *)((SegmentReader *)local_598._0_8_)->arena->_vptr_Arena)
              (local_598._0_8_,
               (long)(EventPort **)uVar2 + (long)(*(EventPort **)uVar2)[-2]._vptr_EventPort);
    pvVar20 = extraout_RDX_01;
  }
  Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
  ::send((Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
          *)local_598,(int)local_528,pvVar20,(size_t)pEVar17,iVar16);
  AnyPointer::Pipeline::getPointerField((Pipeline *)local_3c8,(Pipeline *)(local_598 + 0x10),1);
  local_5d8._0_8_ = local_3c8._0_8_;
  local_5d8._8_8_ = local_3c8._8_8_;
  local_5c8 = (EventLoop *)local_3c8._16_8_;
  pEStack_5c0 = (EventLoop *)local_3c8._24_8_;
  pEStack_5b8 = (Event *)local_3c8._32_8_;
  capnproto_test::capnp::test::TestPipeline::Box::Pipeline::getCap
            ((Client *)&local_560,(Pipeline *)local_5d8);
  local_1e0.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::fooRequest
            ((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
              *)local_468,(Client *)&local_560,&local_1e0);
  pvVar20 = local_560.super_Builder._builder.data;
  pvVar21 = extraout_RDX_02;
  if ((long *)local_560.super_Builder._builder.data != (long *)0x0) {
    local_560.super_Builder._builder.data = (long *)0x0;
    (**((local_560.super_Builder._builder.capTable)->super_CapTableReader)._vptr_CapTableReader)
              (local_560.super_Builder._builder.capTable,(long)pvVar20 + *(long *)(*pvVar20 + -0x10)
              );
    pvVar21 = extraout_RDX_03;
  }
  pEVar18 = pEStack_5c0;
  pEVar19 = local_5c8;
  if (local_5c8 != (EventLoop *)0x0) {
    local_5c8 = (EventLoop *)0x0;
    pEStack_5c0 = (EventLoop *)0x0;
    pEVar17 = pEVar18;
    (**pEStack_5b8->_vptr_Event)(pEStack_5b8,pEVar19,8,pEVar18,pEVar18,0);
    iVar16 = (int)pEVar17;
    pEVar17 = pEVar18;
    pvVar21 = extraout_RDX_04;
  }
  uVar2 = local_5d8._8_8_;
  if ((Impl *)local_5d8._8_8_ != (Impl *)0x0) {
    local_5d8._8_8_ = (Impl *)0x0;
    (*(code *)((SegmentReader *)local_5d8._0_8_)->arena->_vptr_Arena)
              (local_5d8._0_8_,
               ((BootstrapFactoryBase *)uVar2)->_vptr_BootstrapFactoryBase[-2] +
               (long)(BootstrapFactoryBase *)uVar2);
    pvVar21 = extraout_RDX_05;
  }
  *(Type *)local_468._16_8_ = 0x141;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send(&local_560,(int)local_468,pvVar21,(size_t)pEVar17,iVar16);
  AnyPointer::Pipeline::getPointerField((Pipeline *)local_3c8,(Pipeline *)(local_598 + 0x10),1);
  local_5d8._0_8_ = local_3c8._0_8_;
  local_5d8._8_8_ = local_3c8._8_8_;
  local_5c8 = (EventLoop *)local_3c8._16_8_;
  pEStack_5c0 = (EventLoop *)local_3c8._24_8_;
  pEStack_5b8 = (Event *)local_3c8._32_8_;
  capnproto_test::capnp::test::TestPipeline::Box::Pipeline::getCap
            ((Client *)&local_5f0,(Pipeline *)local_5d8);
  (**(code **)(**(long **)((long)&local_5f0.size_ + *(long *)(local_5f0.ptr + -0x18)) + 0x20))
            (local_3c8);
  local_4e0.super_Builder._builder.capTable = (CapTableBuilder *)local_3c8._0_8_;
  local_4e0.super_Builder._builder.data = (void *)local_3c8._8_8_;
  local_4e0.super_Builder._builder.segment =
       (SegmentBuilder *)&capnproto_test::capnp::test::TestExtends::Client::typeinfo;
  local_1f8.ptr.isSet = false;
  capnproto_test::capnp::test::TestExtends::Client::graultRequest
            ((Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
              *)local_4a8,(Client *)&local_4e0,&local_1f8);
  pvVar20 = local_4e0.super_Builder._builder.data;
  pvVar21 = extraout_RDX_06;
  if ((Impl *)local_4e0.super_Builder._builder.data != (Impl *)0x0) {
    local_4e0.super_Builder._builder.data = (Impl *)0x0;
    (**((local_4e0.super_Builder._builder.capTable)->super_CapTableReader)._vptr_CapTableReader)
              (local_4e0.super_Builder._builder.capTable,
               ((BootstrapFactoryBase *)pvVar20)->_vptr_BootstrapFactoryBase[-2] +
               (long)(BootstrapFactoryBase *)pvVar20);
    pvVar21 = extraout_RDX_07;
  }
  plVar1 = local_5e0;
  if (local_5e0 != (long *)0x0) {
    local_5e0 = (long *)0x0;
    (*(code *)**(undefined8 **)local_5f0.size_)
              (local_5f0.size_,(long)plVar1 + *(long *)(*plVar1 + -0x10));
    pvVar21 = extraout_RDX_08;
  }
  pEVar18 = pEStack_5c0;
  pEVar19 = local_5c8;
  if (local_5c8 != (EventLoop *)0x0) {
    local_5c8 = (EventLoop *)0x0;
    pEStack_5c0 = (EventLoop *)0x0;
    pEVar17 = pEVar18;
    (**pEStack_5b8->_vptr_Event)(pEStack_5b8,pEVar19,8,pEVar18,pEVar18,0);
    iVar16 = (int)pEVar17;
    pEVar17 = pEVar18;
    pvVar21 = extraout_RDX_09;
  }
  uVar2 = local_5d8._8_8_;
  if ((Impl *)local_5d8._8_8_ != (Impl *)0x0) {
    local_5d8._8_8_ = (Impl *)0x0;
    (*(code *)((SegmentReader *)local_5d8._0_8_)->arena->_vptr_Arena)
              (local_5d8._0_8_,
               ((BootstrapFactoryBase *)uVar2)->_vptr_BootstrapFactoryBase[-2] +
               (long)(BootstrapFactoryBase *)uVar2);
    pvVar21 = extraout_RDX_10;
  }
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  ::send(&local_4e0,(int)local_4a8,pvVar21,(size_t)pEVar17,iVar16);
  local_3c8._32_8_ = (Event *)0x0;
  local_3c8._40_8_ = (Event **)0x0;
  local_3c8._16_8_ = (WirePointer *)0x0;
  local_3c8._24_8_ = (EventLoop *)0x0;
  local_3c8._0_8_ = (_func_int **)0x0;
  local_3c8._8_8_ = (Server *)0x0;
  local_3c8._48_8_ = (ArrayDisposer *)0x0;
  RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>::operator=
            ((RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults> *)local_598,
             (RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults> *)local_3c8);
  ppEVar22 = (Event **)local_3c8._40_8_;
  uVar2 = local_3c8._32_8_;
  if ((Event *)local_3c8._32_8_ != (Event *)0x0) {
    local_3c8._32_8_ = (Event *)0x0;
    local_3c8._40_8_ = (Event **)0x0;
    (***(_func_int ***)local_3c8._48_8_)(local_3c8._48_8_,uVar2,8,ppEVar22,ppEVar22,0);
    iVar16 = (int)ppEVar22;
  }
  uVar2 = local_3c8._24_8_;
  if ((EventLoop *)local_3c8._24_8_ != (EventLoop *)0x0) {
    local_3c8._24_8_ = (EventLoop *)0x0;
    (**(code **)*(WirePointer *)local_3c8._16_8_)
              (local_3c8._16_8_,
               (long)(*(EventPort **)uVar2)[-2]._vptr_EventPort + (long)(EventPort **)uVar2);
  }
  uVar2 = local_3c8._8_8_;
  if ((Server *)local_3c8._8_8_ != (Server *)0x0) {
    local_3c8._8_8_ = (Server *)0x0;
    (**(code **)*(_func_int **)local_3c8._0_8_)
              (local_3c8._0_8_,(char *)(uVar2 + (long)(*(_func_int ***)uVar2)[-2]));
  }
  if (local_5f8 != 0 && kj::_::Debug::minSeverity < 3) {
    local_3c8._0_8_ = local_3c8._0_8_ & 0xffffffff00000000;
    iVar16 = 0x4a9286;
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0xb6,ERROR,"\"failed: expected \" \"(0) == (callCount)\", 0, callCount",
               (char (*) [36])"failed: expected (0) == (callCount)",(int *)local_3c8,&local_5f8);
  }
  if ((local_5f4 != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_3c8._0_8_ = local_3c8._0_8_ & 0xffffffff00000000;
    iVar16 = 0x4ddd7f;
    kj::_::Debug::log<char_const(&)[43],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0xb7,ERROR,
               "\"failed: expected \" \"(0) == (reverseCallCount)\", 0, reverseCallCount",
               (char (*) [43])"failed: expected (0) == (reverseCallCount)",(int *)local_3c8,
               &local_5f4);
  }
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> *)
             local_3c8,&local_560);
  bVar24 = local_3c8._36_2_ == 0;
  local_5c8 = (EventLoop *)local_3c8._24_8_;
  if (bVar24) {
    local_5c8 = (EventLoop *)0x0;
  }
  iVar15 = 0x7fffffff;
  if (!bVar24) {
    iVar15 = local_3c8._40_4_;
  }
  local_5d8._0_4_ = 0;
  local_5d8._4_4_ = 0;
  local_5d8._8_4_ = 0;
  local_5d8._12_4_ = 0;
  if (!bVar24) {
    local_5d8._0_4_ = local_3c8._0_4_;
    local_5d8._4_4_ = local_3c8._4_4_;
    local_5d8._8_4_ = local_3c8._8_4_;
    local_5d8._12_4_ = local_3c8._12_4_;
  }
  pEStack_5c0 = (EventLoop *)CONCAT44(pEStack_5c0._4_4_,iVar15);
  RVar27 = PointerReader::getBlob<capnp::Text>((PointerReader *)local_5d8,(void *)0x0,0);
  if (((RVar27.super_StringPtr.content.size_ != 4) ||
      ((char)RVar27.super_StringPtr.content.ptr[1] != 'r' ||
       *RVar27.super_StringPtr.content.ptr != 0x6162)) && (kj::_::Debug::minSeverity < 3)) {
    bVar24 = local_3c8._36_2_ == 0;
    local_5c8 = (EventLoop *)local_3c8._24_8_;
    if (bVar24) {
      local_5c8 = (EventLoop *)0x0;
    }
    iVar16 = 0x7fffffff;
    if (!bVar24) {
      iVar16 = local_3c8._40_4_;
    }
    local_5d8._0_4_ = 0;
    local_5d8._4_4_ = 0;
    local_5d8._8_4_ = 0;
    local_5d8._12_4_ = 0;
    if (!bVar24) {
      local_5d8._0_4_ = local_3c8._0_4_;
      local_5d8._4_4_ = local_3c8._4_4_;
      local_5d8._8_4_ = local_3c8._8_4_;
      local_5d8._12_4_ = local_3c8._12_4_;
    }
    pEStack_5c0 = (EventLoop *)CONCAT44(pEStack_5c0._4_4_,iVar16);
    local_5f0 = (ArrayPtr<const_char>)
                PointerReader::getBlob<capnp::Text>((PointerReader *)local_5d8,(void *)0x0,0);
    iVar16 = 0x4a964f;
    kj::_::Debug::log<char_const(&)[46],char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0xba,ERROR,
               "\"failed: expected \" \"(\\\"bar\\\") == (response.getX())\", \"bar\", response.getX()"
               ,(char (*) [46])"failed: expected (\"bar\") == (response.getX())",
               (char (*) [4])0x4e245b,(Reader *)&local_5f0);
  }
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_> *)local_5d8,
             &local_4e0);
  reader._reader.capTable = (CapTableReader *)local_5d8._8_8_;
  reader._reader.segment = (SegmentReader *)local_5d8._0_8_;
  reader._reader.data = local_5c8;
  reader._reader.pointers = (WirePointer *)pEStack_5c0;
  reader._reader._32_8_ = pEStack_5b8;
  reader._reader._40_8_ = pDStack_5b0;
  checkTestMessage(reader);
  if (local_5f8 != 3 && kj::_::Debug::minSeverity < 3) {
    local_5f0.ptr._0_4_ = 3;
    iVar16 = 0x4a96b4;
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0xbf,ERROR,"\"failed: expected \" \"(3) == (callCount)\", 3, callCount",
               (char (*) [36])"failed: expected (3) == (callCount)",(int *)&local_5f0,&local_5f8);
  }
  if ((local_5f4 != 1) && (kj::_::Debug::minSeverity < 3)) {
    local_5f0.ptr._0_4_ = 1;
    iVar16 = 0x4dddef;
    kj::_::Debug::log<char_const(&)[43],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0xc0,ERROR,
               "\"failed: expected \" \"(1) == (reverseCallCount)\", 1, reverseCallCount",
               (char (*) [43])"failed: expected (1) == (reverseCallCount)",(int *)&local_5f0,
               &local_5f4);
  }
  plVar1 = local_5a0;
  if (local_5a0 != (long *)0x0) {
    local_5a0 = (long *)0x0;
    (**local_5a8->_vptr_RequestHook)(local_5a8,(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  uVar2 = local_3c8._56_8_;
  if ((Disposer *)local_3c8._56_8_ != (Disposer *)0x0) {
    local_3c8._56_8_ = (Disposer *)0x0;
    (***(_func_int ***)local_3c8._48_8_)(local_3c8._48_8_,(*(_func_int ***)uVar2)[-2] + uVar2);
  }
  pDVar23 = local_4e0.hook.disposer;
  uVar2 = local_4e0.super_Builder._builder._32_8_;
  if (local_4e0.super_Builder._builder._32_8_ != 0) {
    local_4e0.super_Builder._builder.dataSize = 0;
    local_4e0.super_Builder._builder.pointerCount = 0;
    local_4e0.super_Builder._builder._38_2_ = 0;
    local_4e0.hook.disposer = (Disposer *)0x0;
    (**(local_4e0.hook.ptr)->_vptr_RequestHook)(local_4e0.hook.ptr,uVar2,8,pDVar23,pDVar23,0);
    iVar16 = (int)pDVar23;
  }
  pWVar7 = local_4e0.super_Builder._builder.pointers;
  if (local_4e0.super_Builder._builder.pointers != (WirePointer *)0x0) {
    local_4e0.super_Builder._builder.pointers = (WirePointer *)0x0;
    (**((BootstrapFactoryBase *)local_4e0.super_Builder._builder.data)->_vptr_BootstrapFactoryBase)
              (local_4e0.super_Builder._builder.data,
               (long)&(pWVar7->offsetAndKind).value + *(long *)((long)*pWVar7 + -0x10));
  }
  pCVar6 = local_4e0.super_Builder._builder.capTable;
  if (local_4e0.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_4e0.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (**(code **)((local_4e0.super_Builder._builder.segment)->super_SegmentReader).arena)
              (local_4e0.super_Builder._builder.segment,
               (pCVar6->super_CapTableReader)._vptr_CapTableReader[-2] +
               (long)&(pCVar6->super_CapTableReader)._vptr_CapTableReader);
  }
  pRVar3 = local_478;
  if (local_478 != (RequestHook *)0x0) {
    local_478 = (RequestHook *)0x0;
    (**pDStack_480->_vptr_Disposer)
              (pDStack_480,pRVar3->_vptr_RequestHook[-2] + (long)&pRVar3->_vptr_RequestHook);
  }
  pDVar23 = local_560.hook.disposer;
  uVar2 = local_560.super_Builder._builder._32_8_;
  if (local_560.super_Builder._builder._32_8_ != 0) {
    local_560.super_Builder._builder.dataSize = 0;
    local_560.super_Builder._builder.pointerCount = 0;
    local_560.super_Builder._builder._38_2_ = 0;
    local_560.hook.disposer = (Disposer *)0x0;
    (**(local_560.hook.ptr)->_vptr_RequestHook)(local_560.hook.ptr,uVar2,8,pDVar23,pDVar23,0);
    iVar16 = (int)pDVar23;
  }
  pWVar7 = local_560.super_Builder._builder.pointers;
  if (local_560.super_Builder._builder.pointers != (WirePointer *)0x0) {
    local_560.super_Builder._builder.pointers = (WirePointer *)0x0;
    (*(code *)**local_560.super_Builder._builder.data)
              (local_560.super_Builder._builder.data,
               (long)&(pWVar7->offsetAndKind).value + *(long *)((long)*pWVar7 + -0x10));
  }
  pCVar6 = local_560.super_Builder._builder.capTable;
  if (local_560.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_560.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_560.super_Builder._builder.segment)->super_SegmentReader).arena)->_vptr_Arena
    )(local_560.super_Builder._builder.segment,
      (pCVar6->super_CapTableReader)._vptr_CapTableReader[-2] + (long)&pCVar6->super_CapTableReader)
    ;
  }
  pRVar3 = local_438;
  if (local_438 != (RequestHook *)0x0) {
    local_438 = (RequestHook *)0x0;
    (**pDStack_440->_vptr_Disposer)
              (pDStack_440,pRVar3->_vptr_RequestHook[-2] + (long)&pRVar3->_vptr_RequestHook);
  }
  pDVar23 = pDStack_570;
  pPVar4 = local_578;
  if (local_578 != (PipelineOp *)0x0) {
    local_578 = (PipelineOp *)0x0;
    pDStack_570 = (Disposer *)0x0;
    (**local_568->_vptr_ArrayDisposer)(local_568,pPVar4,8,pDVar23,pDVar23,0);
    iVar16 = (int)pDVar23;
  }
  uVar2 = local_598._24_8_;
  if ((WirePointer *)local_598._24_8_ != (WirePointer *)0x0) {
    local_598._24_8_ = (WirePointer *)0x0;
    (***(_func_int ***)local_598._16_8_)
              (local_598._16_8_,
               (long)&((WireValue<uint32_t>_conflict *)uVar2)->value +
               *(long *)((long)*(WirePointer *)uVar2 + -0x10));
  }
  uVar2 = local_598._8_8_;
  if ((EventLoop *)local_598._8_8_ != (EventLoop *)0x0) {
    local_598._8_8_ = (EventLoop *)0x0;
    (*(code *)((SegmentReader *)local_598._0_8_)->arena->_vptr_Arena)
              (local_598._0_8_,
               (long)(EventPort **)uVar2 + (long)(*(EventPort **)uVar2)[-2]._vptr_EventPort);
  }
  pAVar5 = local_518.ops.disposer;
  if (local_518.ops.disposer != (ArrayDisposer *)0x0) {
    local_518.ops.disposer = (ArrayDisposer *)0x0;
    (***(_func_int ***)local_518.ops.size_)
              (local_518.ops.size_,
               pAVar5->_vptr_ArrayDisposer[-2] + (long)&pAVar5->_vptr_ArrayDisposer);
  }
  if ((local_5f9 == '\x01') && (kj::_::Debug::minSeverity < 3)) {
    iVar16 = 0x4dde40;
    kj::_::Debug::log<char_const(&)[33]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0xc3,ERROR,"\"failed: expected \" \"!(disconnected)\"",
               (char (*) [33])"failed: expected !(disconnected)");
  }
  (*((local_418.pipe.ptr)->super_AsyncInputStream)._vptr_AsyncInputStream[4])();
  local_3c8._0_8_ = local_3c8._0_8_ & 0xffffffffffffff00;
  local_3c8[0x160] = '\0';
  kj::_::waitImpl(&local_4f0,(ExceptionOrValue *)local_3c8,local_3d8);
  if (local_3c8[0x160] == '\x01') {
    if (local_3c8[0] != false) {
      kj::throwRecoverableException((Exception *)(local_3c8 + 8),0);
    }
  }
  else {
    if (local_3c8[0] == false) {
      kj::_::unreachable();
    }
    kj::throwRecoverableException((Exception *)(local_3c8 + 8),0);
  }
  if (local_3c8[0] == true) {
    kj::Exception::~Exception((Exception *)(local_3c8 + 8));
  }
  local_210.ptr.isSet = false;
  capnproto_test::capnp::test::TestPipeline::Client::getCapRequest
            ((Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
              *)local_5d8,(Client *)local_430,&local_210);
  *(undefined4 *)&local_5c8->port = 0xea;
  kj::heap<capnp::_::TestInterfaceImpl,int&>((kj *)local_598,&local_5f4);
  pEVar17 = (EventLoop *)local_598._8_8_;
  local_3c8._0_8_ = local_598._0_8_;
  local_3c8._8_8_ = local_598._8_8_ + 0x10;
  if ((EventLoop *)local_598._8_8_ == (EventLoop *)0x0) {
    local_3c8._8_8_ = (Server *)0x0;
  }
  local_598._8_8_ = (PromiseNode *)0x0;
  OVar26 = Capability::Client::makeLocalClient
                     ((Client *)(local_528 + 8),(Own<capnp::Capability::Server> *)local_3c8);
  uVar2 = local_3c8._8_8_;
  if ((Server *)local_3c8._8_8_ != (Server *)0x0) {
    local_3c8._8_8_ = (Server *)0x0;
    (**(code **)*(_func_int **)local_3c8._0_8_)
              (local_3c8._0_8_,(char *)(uVar2 + (long)(*(Event **)uVar2)[-1].prev),OVar26.ptr);
  }
  local_528._0_8_ = &Capability::Client::typeinfo;
  local_3c8._0_8_ = local_5d8._0_8_;
  local_3c8._8_8_ = local_5d8._8_8_;
  local_3c8._16_8_ = pEStack_5c0;
  PointerBuilder::setCapability
            ((PointerBuilder *)local_3c8,(Own<capnp::ClientHook> *)(local_528 + 8));
  pDVar23 = local_518.hook.disposer;
  pvVar20 = extraout_RDX_11;
  if (local_518.hook.disposer != (Disposer *)0x0) {
    local_518.hook.disposer = (Disposer *)0x0;
    (**((BootstrapFactoryBase *)local_528._8_8_)->_vptr_BootstrapFactoryBase)
              (local_528._8_8_,pDVar23->_vptr_Disposer[-2] + (long)&pDVar23->_vptr_Disposer);
    pvVar20 = extraout_RDX_12;
  }
  uVar2 = local_598._8_8_;
  if ((PromiseNode *)local_598._8_8_ != (PromiseNode *)0x0) {
    local_598._8_8_ = (PromiseNode *)0x0;
    (*(code *)((SegmentReader *)local_598._0_8_)->arena->_vptr_Arena)
              (local_598._0_8_,
               ((CapTableReader *)uVar2)->_vptr_CapTableReader[-2] + (long)(CapTableReader *)uVar2);
    pvVar20 = extraout_RDX_13;
  }
  Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
  ::send((Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
          *)local_528,(int)local_5d8,pvVar20,(size_t)pEVar17,iVar16);
  AnyPointer::Pipeline::getPointerField((Pipeline *)local_3c8,&local_518,1);
  local_468._0_8_ = local_3c8._0_8_;
  local_468._8_8_ = local_3c8._8_8_;
  local_468._16_8_ = local_3c8._16_8_;
  local_468._24_8_ = local_3c8._24_8_;
  pEStack_448 = (Event *)local_3c8._32_8_;
  capnproto_test::capnp::test::TestPipeline::Box::Pipeline::getCap
            ((Client *)&local_560,(Pipeline *)local_468);
  local_228.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::fooRequest
            ((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
              *)local_598,(Client *)&local_560,&local_228);
  pvVar20 = local_560.super_Builder._builder.data;
  pvVar21 = extraout_RDX_14;
  if ((long *)local_560.super_Builder._builder.data != (long *)0x0) {
    local_560.super_Builder._builder.data = (long *)0x0;
    (**((local_560.super_Builder._builder.capTable)->super_CapTableReader)._vptr_CapTableReader)
              (local_560.super_Builder._builder.capTable,(long)pvVar20 + *(long *)(*pvVar20 + -0x10)
              );
    pvVar21 = extraout_RDX_15;
  }
  pEVar19 = (EventLoop *)local_468._24_8_;
  uVar2 = local_468._16_8_;
  if ((WirePointer *)local_468._16_8_ != (WirePointer *)0x0) {
    local_468._16_8_ = (WirePointer *)0x0;
    local_468._24_8_ = (EventLoop *)0x0;
    pEVar17 = pEVar19;
    (**pEStack_448->_vptr_Event)(pEStack_448,uVar2,8,pEVar19,pEVar19,0);
    iVar16 = (int)pEVar17;
    pEVar17 = pEVar19;
    pvVar21 = extraout_RDX_16;
  }
  uVar2 = local_468._8_8_;
  if ((Impl *)local_468._8_8_ != (Impl *)0x0) {
    local_468._8_8_ = (Impl *)0x0;
    (*(code *)((SegmentReader *)local_468._0_8_)->arena->_vptr_Arena)
              (local_468._0_8_,
               ((BootstrapFactoryBase *)uVar2)->_vptr_BootstrapFactoryBase[-2] +
               (long)(BootstrapFactoryBase *)uVar2);
    pvVar21 = extraout_RDX_17;
  }
  *(undefined4 *)(_func_int ***)local_598._16_8_ = 0x141;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
          *)local_468,(int)local_598,pvVar21,(size_t)pEVar17,iVar16);
  AnyPointer::Pipeline::getPointerField((Pipeline *)local_3c8,&local_518,1);
  local_4a8._0_8_ = local_3c8._0_8_;
  local_4a8._8_8_ = local_3c8._8_8_;
  local_4a8._16_8_ = local_3c8._16_8_;
  local_4a8._24_8_ = local_3c8._24_8_;
  pEStack_488 = (Event *)local_3c8._32_8_;
  capnproto_test::capnp::test::TestPipeline::Box::Pipeline::getCap
            ((Client *)&local_5f0,(Pipeline *)local_4a8);
  (**(code **)(**(long **)((long)&local_5f0.size_ + *(long *)(local_5f0.ptr + -0x18)) + 0x20))
            (local_3c8);
  local_4e0.super_Builder._builder.capTable = (CapTableBuilder *)local_3c8._0_8_;
  local_4e0.super_Builder._builder.data = (void *)local_3c8._8_8_;
  local_4e0.super_Builder._builder.segment =
       (SegmentBuilder *)&capnproto_test::capnp::test::TestExtends::Client::typeinfo;
  local_240.ptr.isSet = false;
  capnproto_test::capnp::test::TestExtends::Client::graultRequest
            ((Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
              *)&local_560,(Client *)&local_4e0,&local_240);
  pvVar20 = local_4e0.super_Builder._builder.data;
  pvVar21 = extraout_RDX_18;
  if ((Impl *)local_4e0.super_Builder._builder.data != (Impl *)0x0) {
    local_4e0.super_Builder._builder.data = (Impl *)0x0;
    (**((local_4e0.super_Builder._builder.capTable)->super_CapTableReader)._vptr_CapTableReader)
              (local_4e0.super_Builder._builder.capTable,
               ((BootstrapFactoryBase *)pvVar20)->_vptr_BootstrapFactoryBase[-2] +
               (long)(BootstrapFactoryBase *)pvVar20);
    pvVar21 = extraout_RDX_19;
  }
  plVar1 = local_5e0;
  if (local_5e0 != (long *)0x0) {
    local_5e0 = (long *)0x0;
    (*(code *)**(undefined8 **)local_5f0.size_)
              (local_5f0.size_,(long)plVar1 + *(long *)(*plVar1 + -0x10));
    pvVar21 = extraout_RDX_20;
  }
  pEVar19 = (EventLoop *)local_4a8._24_8_;
  uVar2 = local_4a8._16_8_;
  if ((WirePointer *)local_4a8._16_8_ != (WirePointer *)0x0) {
    local_4a8._16_8_ = (WirePointer *)0x0;
    local_4a8._24_8_ = (EventLoop *)0x0;
    pEVar17 = pEVar19;
    (**pEStack_488->_vptr_Event)(pEStack_488,uVar2,8,pEVar19,pEVar19,0);
    iVar16 = (int)pEVar17;
    pEVar17 = pEVar19;
    pvVar21 = extraout_RDX_21;
  }
  uVar2 = local_4a8._8_8_;
  if ((Impl *)local_4a8._8_8_ != (Impl *)0x0) {
    local_4a8._8_8_ = (Impl *)0x0;
    (*(code *)((SegmentReader *)local_4a8._0_8_)->arena->_vptr_Arena)
              (local_4a8._0_8_,
               ((BootstrapFactoryBase *)uVar2)->_vptr_BootstrapFactoryBase[-2] +
               (long)(BootstrapFactoryBase *)uVar2);
    pvVar21 = extraout_RDX_22;
  }
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  ::send((Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
          *)local_4a8,(int)&local_560,pvVar21,(size_t)pEVar17,iVar16);
  local_4e0.super_Builder._builder.segment = (SegmentBuilder *)&PTR_run_00610dc8;
  local_4e0.super_Builder._builder.capTable = (CapTableBuilder *)local_468;
  local_4e0.super_Builder._builder.data = &local_3f8;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)local_3c8,(Runnable *)&local_4e0);
  if (local_3c8[0] == true) {
    kj::Exception::~Exception((Exception *)(local_3c8 + 8));
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[110]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0xdb,ERROR,
               "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { pipelinePromise.wait(ioContext.waitScope); }) != nullptr\""
               ,(char (*) [110])
                "failed: expected ::kj::runCatchingExceptions([&]() { pipelinePromise.wait(ioContext.waitScope); }) != nullptr"
              );
  }
  local_4e0.super_Builder._builder.segment = (SegmentBuilder *)&PTR_run_00610df8;
  local_4e0.super_Builder._builder.capTable = (CapTableBuilder *)local_4a8;
  local_4e0.super_Builder._builder.data = &local_3f8;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)local_3c8,(Runnable *)&local_4e0);
  if (local_3c8[0] == true) {
    kj::Exception::~Exception((Exception *)(local_3c8 + 8));
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[111]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0xdc,ERROR,
               "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { pipelinePromise2.wait(ioContext.waitScope); }) != nullptr\""
               ,(char (*) [111])
                "failed: expected ::kj::runCatchingExceptions([&]() { pipelinePromise2.wait(ioContext.waitScope); }) != nullptr"
              );
  }
  if (kj::_::Debug::minSeverity < 3 && local_5f8 != 3) {
    local_3c8._0_4_ = 3;
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0xde,ERROR,"\"failed: expected \" \"(3) == (callCount)\", 3, callCount",
               (char (*) [36])"failed: expected (3) == (callCount)",(int *)local_3c8,&local_5f8);
  }
  if ((local_5f4 != 1) && (kj::_::Debug::minSeverity < 3)) {
    local_3c8._0_4_ = 1;
    kj::_::Debug::log<char_const(&)[43],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0xdf,ERROR,
               "\"failed: expected \" \"(1) == (reverseCallCount)\", 1, reverseCallCount",
               (char (*) [43])"failed: expected (1) == (reverseCallCount)",(int *)local_3c8,
               &local_5f4);
  }
  pDVar23 = pDStack_480;
  pEVar11 = pEStack_488;
  if (pEStack_488 != (Event *)0x0) {
    pEStack_488 = (Event *)0x0;
    pDStack_480 = (Disposer *)0x0;
    (**local_478->_vptr_RequestHook)(local_478,pEVar11,8,pDVar23,pDVar23,0);
  }
  uVar2 = local_4a8._24_8_;
  if ((EventLoop *)local_4a8._24_8_ != (EventLoop *)0x0) {
    local_4a8._24_8_ = (EventLoop *)0x0;
    (**(code **)*(WirePointer *)local_4a8._16_8_)
              (local_4a8._16_8_,
               (long)(EventPort **)uVar2 + (long)(*(EventPort **)uVar2)[-2]._vptr_EventPort);
  }
  uVar2 = local_4a8._8_8_;
  if ((Impl *)local_4a8._8_8_ != (Impl *)0x0) {
    local_4a8._8_8_ = (Impl *)0x0;
    (*(code *)((SegmentReader *)local_4a8._0_8_)->arena->_vptr_Arena)
              (local_4a8._0_8_,
               ((BootstrapFactoryBase *)uVar2)->_vptr_BootstrapFactoryBase[-2] +
               (long)(BootstrapFactoryBase *)uVar2);
  }
  pRVar3 = local_560.hook.ptr;
  if (local_560.hook.ptr != (RequestHook *)0x0) {
    local_560.hook.ptr = (RequestHook *)0x0;
    (**(local_560.hook.disposer)->_vptr_Disposer)
              (local_560.hook.disposer,
               pRVar3->_vptr_RequestHook[-2] + (long)&pRVar3->_vptr_RequestHook);
  }
  pDVar23 = pDStack_440;
  pEVar11 = pEStack_448;
  if (pEStack_448 != (Event *)0x0) {
    pEStack_448 = (Event *)0x0;
    pDStack_440 = (Disposer *)0x0;
    (**local_438->_vptr_RequestHook)(local_438,pEVar11,8,pDVar23,pDVar23,0);
  }
  uVar2 = local_468._24_8_;
  if ((EventLoop *)local_468._24_8_ != (EventLoop *)0x0) {
    local_468._24_8_ = (EventLoop *)0x0;
    (**(code **)*(WirePointer *)local_468._16_8_)
              (local_468._16_8_,
               (long)(EventPort **)uVar2 + (long)(*(EventPort **)uVar2)[-2]._vptr_EventPort);
  }
  uVar2 = local_468._8_8_;
  if ((Impl *)local_468._8_8_ != (Impl *)0x0) {
    local_468._8_8_ = (Impl *)0x0;
    (*(code *)((SegmentReader *)local_468._0_8_)->arena->_vptr_Arena)
              (local_468._0_8_,
               ((BootstrapFactoryBase *)uVar2)->_vptr_BootstrapFactoryBase[-2] +
               (long)(BootstrapFactoryBase *)uVar2);
  }
  pAVar5 = local_568;
  if (local_568 != (ArrayDisposer *)0x0) {
    local_568 = (ArrayDisposer *)0x0;
    (**pDStack_570->_vptr_Disposer)
              (pDStack_570,pAVar5->_vptr_ArrayDisposer[-2] + (long)&pAVar5->_vptr_ArrayDisposer);
  }
  sVar9 = local_518.ops.size_;
  pPVar4 = local_518.ops.ptr;
  if (local_518.ops.ptr != (PipelineOp *)0x0) {
    local_518.ops.ptr = (PipelineOp *)0x0;
    local_518.ops.size_ = 0;
    (**(local_518.ops.disposer)->_vptr_ArrayDisposer)(local_518.ops.disposer,pPVar4,8,sVar9,sVar9,0)
    ;
  }
  pPVar8 = local_518.hook.ptr;
  if ((WirePointer *)local_518.hook.ptr != (WirePointer *)0x0) {
    local_518.hook.ptr = (PipelineHook *)0x0;
    (**(local_518.hook.disposer)->_vptr_Disposer)
              (local_518.hook.disposer,
               (long)&((WireValue<uint32_t>_conflict *)&pPVar8->_vptr_PipelineHook)->value +
               *(long *)((long)*(WirePointer *)pPVar8 + -0x10));
  }
  uVar2 = local_528._8_8_;
  if ((Impl *)local_528._8_8_ != (Impl *)0x0) {
    local_528._8_8_ = (Impl *)0x0;
    (**(code **)((SegmentReader *)local_528._0_8_)->arena)
              (local_528._0_8_,
               ((BootstrapFactoryBase *)uVar2)->_vptr_BootstrapFactoryBase[-2] +
               (long)(BootstrapFactoryBase *)uVar2);
  }
  pRVar3 = local_5a8;
  if (local_5a8 != (RequestHook *)0x0) {
    local_5a8 = (RequestHook *)0x0;
    (**pDStack_5b0->_vptr_Disposer)
              (pDStack_5b0,pRVar3->_vptr_RequestHook[-2] + (long)&pRVar3->_vptr_RequestHook);
  }
  pSVar12 = pSStack_420;
  if (pSStack_420 != (Server *)0x0) {
    pSStack_420 = (Server *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_430._12_4_,local_430._8_4_))
              ((undefined8 *)CONCAT44(local_430._12_4_,local_430._8_4_),
               pSVar12->_vptr_Server[-2] + (long)&pSVar12->_vptr_Server);
  }
  pPVar10 = local_4f0.ptr;
  if ((TransformPromiseNodeBase *)local_4f0.ptr != (TransformPromiseNodeBase *)0x0) {
    local_4f0.ptr = (PromiseNode *)0x0;
    (**(local_4f0.disposer)->_vptr_Disposer)
              (local_4f0.disposer,
               ((PromiseNode *)&pPVar10->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
               (long)&((PromiseNode *)&pPVar10->_vptr_PromiseNode)->_vptr_PromiseNode);
  }
  RpcSystemBase::~RpcSystemBase(&local_258);
  TwoPartyVatNetwork::~TwoPartyVatNetwork(&local_1b0);
  pAVar13 = local_418.pipe.ptr;
  if (local_418.pipe.ptr != (AsyncIoStream *)0x0) {
    local_418.pipe.ptr = (AsyncIoStream *)0x0;
    (**(local_418.pipe.disposer)->_vptr_Disposer)
              (local_418.pipe.disposer,
               (pAVar13->super_AsyncInputStream)._vptr_AsyncInputStream[-2] +
               (long)&(pAVar13->super_AsyncInputStream)._vptr_AsyncInputStream);
  }
  if (local_418.thread.ptr != (Thread *)0x0) {
    local_418.thread.ptr = (Thread *)0x0;
    (**(local_418.thread.disposer)->_vptr_Disposer)();
  }
  pAVar14 = local_3e0;
  if (local_3e0 != (AsyncIoProvider *)0x0) {
    local_3e0 = (AsyncIoProvider *)0x0;
    (**(code **)*local_3e8)
              (local_3e8,pAVar14->_vptr_AsyncIoProvider[-2] + (long)&pAVar14->_vptr_AsyncIoProvider)
    ;
  }
  plVar1 = local_3f0;
  if (local_3f0 != (long *)0x0) {
    local_3f0 = (long *)0x0;
    (**(code **)*local_3f8)(local_3f8,(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  return;
}

Assistant:

TEST(TwoPartyNetwork, Pipelining) {
  auto ioContext = kj::setupAsyncIo();
  int callCount = 0;
  int handleCount = 0;
  int reverseCallCount = 0;  // Calls back from server to client.

  auto serverThread = runServer(*ioContext.provider, callCount, handleCount);
  TwoPartyVatNetwork network(*serverThread.pipe, rpc::twoparty::Side::CLIENT);
  auto rpcClient = makeRpcClient(network);

  bool disconnected = false;
  kj::Promise<void> disconnectPromise = network.onDisconnect().then([&]() { disconnected = true; });

  {
    // Request the particular capability from the server.
    auto client = getPersistentCap(rpcClient, rpc::twoparty::Side::SERVER,
        test::TestSturdyRefObjectId::Tag::TEST_PIPELINE).castAs<test::TestPipeline>();

    {
      // Use the capability.
      auto request = client.getCapRequest();
      request.setN(234);
      request.setInCap(kj::heap<TestInterfaceImpl>(reverseCallCount));

      auto promise = request.send();

      auto pipelineRequest = promise.getOutBox().getCap().fooRequest();
      pipelineRequest.setI(321);
      auto pipelinePromise = pipelineRequest.send();

      auto pipelineRequest2 = promise.getOutBox().getCap()
          .castAs<test::TestExtends>().graultRequest();
      auto pipelinePromise2 = pipelineRequest2.send();

      promise = nullptr;  // Just to be annoying, drop the original promise.

      EXPECT_EQ(0, callCount);
      EXPECT_EQ(0, reverseCallCount);

      auto response = pipelinePromise.wait(ioContext.waitScope);
      EXPECT_EQ("bar", response.getX());

      auto response2 = pipelinePromise2.wait(ioContext.waitScope);
      checkTestMessage(response2);

      EXPECT_EQ(3, callCount);
      EXPECT_EQ(1, reverseCallCount);
    }

    EXPECT_FALSE(disconnected);

    // What if we disconnect?
    serverThread.pipe->shutdownWrite();

    // The other side should also disconnect.
    disconnectPromise.wait(ioContext.waitScope);

    {
      // Use the now-broken capability.
      auto request = client.getCapRequest();
      request.setN(234);
      request.setInCap(kj::heap<TestInterfaceImpl>(reverseCallCount));

      auto promise = request.send();

      auto pipelineRequest = promise.getOutBox().getCap().fooRequest();
      pipelineRequest.setI(321);
      auto pipelinePromise = pipelineRequest.send();

      auto pipelineRequest2 = promise.getOutBox().getCap()
          .castAs<test::TestExtends>().graultRequest();
      auto pipelinePromise2 = pipelineRequest2.send();

      EXPECT_ANY_THROW(pipelinePromise.wait(ioContext.waitScope));
      EXPECT_ANY_THROW(pipelinePromise2.wait(ioContext.waitScope));

      EXPECT_EQ(3, callCount);
      EXPECT_EQ(1, reverseCallCount);
    }
  }
}